

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase726::run(TestCase726 *this)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  SourceLocation location_02;
  SourceLocation location_03;
  SourceLocation location_04;
  SourceLocation location_05;
  SourceLocation location_06;
  SourceLocation location_07;
  SourceLocation location_08;
  SourceLocation location_09;
  SourceLocation location_10;
  SourceLocation location_11;
  SourceLocation location_12;
  SourceLocation location_13;
  size_t sVar2;
  undefined1 auVar3 [8];
  PromiseBase PVar4;
  PromiseBase PVar5;
  __pid_t _Var6;
  void *pvVar7;
  Event *pEVar8;
  Promise<int> *pPVar9;
  PromiseNode *ptrCopy_2;
  TransformPromiseNodeBase *pTVar10;
  TransformPromiseNodeBase *pTVar11;
  Exception *e;
  PromiseFulfiller<int> *ptrCopy;
  PromiseFulfiller<int> *ptrCopy_1;
  Array<kj::Promise<int>_> result_12;
  Array<kj::Promise<int>_> result;
  Array<kj::Promise<int>_> result_4;
  DebugComparison<int,_int> _kjCondition;
  WaitScope waitScope;
  EventLoop loop;
  char *pcVar12;
  char **ppcVar13;
  Array<kj::Promise<int>_> *pAVar14;
  char *pcVar15;
  char **ppcVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  Array<kj::Promise<int>_> local_898;
  Array<kj::Promise<int>_> local_878;
  undefined8 uStack_860;
  undefined1 local_858 [16];
  undefined1 local_848 [8];
  undefined8 uStack_840;
  Event *local_838;
  char *local_7d0;
  char *pcStack_7c8;
  undefined8 local_7c0;
  int local_7b4;
  char *local_7b0;
  char *pcStack_7a8;
  undefined8 local_7a0;
  DebugComparison<int,_int> local_798 [12];
  __pid_t local_604;
  char *local_600;
  char *pcStack_5f8;
  undefined8 local_5f0;
  char *local_5e8;
  char *pcStack_5e0;
  undefined8 local_5d8;
  char *local_5d0;
  char *pcStack_5c8;
  undefined8 local_5c0;
  char *local_5b8;
  char *pcStack_5b0;
  undefined8 local_5a8;
  char *local_5a0;
  char *pcStack_598;
  undefined8 local_590;
  char *local_588;
  char *pcStack_580;
  undefined8 local_578;
  char *local_570;
  char *pcStack_568;
  undefined8 local_560;
  char *local_558;
  char *pcStack_550;
  undefined8 local_548;
  char *local_540;
  char *pcStack_538;
  undefined8 local_530;
  char *local_528;
  char *pcStack_520;
  undefined8 local_518;
  char *local_510;
  char *pcStack_508;
  undefined8 local_500;
  char *local_4f8;
  char *pcStack_4f0;
  undefined8 local_4e8;
  char *local_4e0;
  char *pcStack_4d8;
  undefined8 local_4d0;
  char *local_4c8;
  char *pcStack_4c0;
  undefined8 local_4b8;
  char *local_4b0;
  char *pcStack_4a8;
  undefined8 local_4a0;
  char *local_498;
  char *pcStack_490;
  undefined8 local_488;
  char *local_480;
  char *pcStack_478;
  undefined8 local_470;
  char *local_468;
  char *pcStack_460;
  undefined8 local_458;
  char *local_450;
  char *pcStack_448;
  undefined8 local_440;
  char *local_438;
  char *pcStack_430;
  undefined8 local_428;
  char *local_420;
  char *pcStack_418;
  undefined8 local_410;
  char *local_408;
  char *pcStack_400;
  undefined8 local_3f8;
  char *local_3f0;
  char *pcStack_3e8;
  undefined8 local_3e0;
  char *local_3d8;
  char *pcStack_3d0;
  undefined8 local_3c8;
  char *local_3c0;
  char *pcStack_3b8;
  undefined8 local_3b0;
  char *local_3a8;
  char *pcStack_3a0;
  undefined8 local_398;
  char *local_390;
  char *pcStack_388;
  undefined8 local_380;
  char *local_378;
  char *pcStack_370;
  undefined8 local_368;
  PromiseBase local_360;
  undefined4 local_358;
  long local_350;
  undefined8 uStack_348;
  undefined1 local_1c8 [8];
  Exception local_1c0;
  
  EventLoop::EventLoop((EventLoop *)local_1c8);
  local_358 = 0xffffffff;
  local_350 = 0;
  uStack_348 = 0;
  local_360.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_1c8;
  EventLoop::enterScope((EventLoop *)local_1c8);
  yield();
  uVar17 = local_798[0]._0_8_;
  pPVar1 = ((PromiseArenaMember *)local_798[0]._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_798[0]._0_8_ - (long)pPVar1) < 0x28) {
    pvVar7 = operator_new(0x400);
    pTVar11 = (TransformPromiseNodeBase *)((long)pvVar7 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)local_798,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:731:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar7 + 0x3d8) = &PTR_destroy_00602848;
    *(void **)((long)pvVar7 + 0x3e0) = pvVar7;
  }
  else {
    ((PromiseArenaMember *)local_798[0]._0_8_)->arena = (PromiseArena *)0x0;
    pTVar11 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)(local_798[0]._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)local_798,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:731:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar17 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00602848;
    ((PromiseArenaMember *)(uVar17 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar17 = local_798[0]._0_8_;
  if ((PromiseArenaMember *)local_798[0]._0_8_ != (PromiseArenaMember *)0x0) {
    local_798[0]._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar17);
  }
  pEVar8 = (Event *)operator_new(0x18);
  pEVar8->next = (Event *)0x0;
  (((PromiseFulfiller<int> *)&pEVar8->_vptr_Event)->super_PromiseRejector)._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_00604eb0;
  (((WeakFulfillerBase *)&pEVar8->loop)->super_Disposer)._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_00604ee8;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<int,kj::_::PromiseAndFulfillerAdapter<int>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<int>&>
            ((PromiseDisposer *)local_798,(WeakFulfiller<int> *)pEVar8);
  uVar17 = local_798[0]._0_8_;
  local_848._0_4_ = local_798[0].left;
  local_848._4_4_ = local_798[0].right;
  uStack_840 = (WeakFulfillerBase *)&pEVar8->loop;
  local_838 = pEVar8;
  local_878.ptr =
       (Promise<int> *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  ((local_878.ptr)->super_PromiseBase).node.ptr = &pTVar11->super_PromiseNode;
  local_878.ptr[1].super_PromiseBase.node.ptr = (PromiseNode *)uVar17;
  local_848 = (undefined1  [8])0x0;
  local_878.size_ = 2;
  local_878.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_370 = "run";
  local_368 = 0x28000002df;
  location.function = "run";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location.lineNumber = 0x2df;
  location.columnNumber = 0x28;
  raceSuccessful<int>(&local_898,location);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_388 = "run";
  local_380 = 0x28000002df;
  uVar17 = 0x28000002df;
  pcVar12 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcVar15 = "run";
  local_798[0].right = Promise<int>::wait((Promise<int> *)&local_898,&local_360);
  pPVar9 = local_898.ptr;
  local_798[0].result = local_798[0].right == 0x7b;
  local_798[0].left = 0x7b;
  local_798[0].op.content.ptr = " == ";
  local_798[0].op.content.size_ = 5;
  if ((PromiseArenaMember *)local_898.ptr != (PromiseArenaMember *)0x0) {
    local_898.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
  }
  sVar2 = local_878.size_;
  pPVar9 = local_878.ptr;
  if (local_878.ptr != (Promise<int> *)0x0) {
    local_878.ptr = (Promise<int> *)0x0;
    local_878.size_ = 0;
    (**(local_878.disposer)->_vptr_ArrayDisposer)
              (local_878.disposer,pPVar9,8,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct,pcVar12,pcVar15,uVar17);
  }
  if ((local_798[0].result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_7d0 = (char *)CONCAT44(local_7d0._4_4_,0x7b);
    local_878.ptr =
         (Promise<int> *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    ((local_878.ptr)->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
    local_878.ptr[1].super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    local_848 = (undefined1  [8])0x0;
    local_878.size_ = 2;
    local_878.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_3a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_3a0 = "run";
    local_398 = 0x28000002df;
    location_00.function = "run";
    location_00.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_00.lineNumber = 0x2df;
    location_00.columnNumber = 0x28;
    raceSuccessful<int>(&local_898,location_00);
    local_3c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_3b8 = "run";
    local_3b0 = 0x28000002df;
    uVar17 = 0x28000002df;
    _Var6 = Promise<int>::wait((Promise<int> *)&local_898,&local_360);
    ppcVar16 = &local_7b0;
    local_7b0 = (char *)CONCAT44(local_7b0._4_4_,_Var6);
    ppcVar13 = &local_7d0;
    kj::_::Debug::log<char_const(&)[106],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2df,ERROR,
               "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope)"
               ,(char (*) [106])
                "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope))"
               ,local_798,(int *)ppcVar13,(int *)ppcVar16);
    pPVar9 = local_898.ptr;
    if ((PromiseArenaMember *)local_898.ptr != (PromiseArenaMember *)0x0) {
      local_898.ptr = (Promise<int> *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
    }
    sVar2 = local_878.size_;
    pPVar9 = local_878.ptr;
    if (local_878.ptr != (Promise<int> *)0x0) {
      local_878.ptr = (Promise<int> *)0x0;
      local_878.size_ = 0;
      (**(local_878.disposer)->_vptr_ArrayDisposer)
                (local_878.disposer,pPVar9,8,sVar2,sVar2,
                 ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct,ppcVar13,ppcVar16,uVar17);
    }
  }
  (**(((WeakFulfillerBase *)&pEVar8->loop)->super_Disposer)._vptr_Disposer)
            ((WeakFulfillerBase *)&pEVar8->loop,
             (_func_int *)
             ((long)&(((PromiseFulfiller<int> *)&pEVar8->_vptr_Event)->super_PromiseRejector).
                     _vptr_PromiseRejector +
             (long)(((PromiseFulfiller<int> *)&pEVar8->_vptr_Event)->super_PromiseRejector).
                   _vptr_PromiseRejector[-2]));
  if (local_350 == 0) {
    EventLoop::leaveScope((EventLoop *)local_360.node.ptr);
  }
  EventLoop::~EventLoop((EventLoop *)local_1c8);
  EventLoop::EventLoop((EventLoop *)local_1c8);
  local_358 = 0xffffffff;
  local_350 = 0;
  uStack_348 = 0;
  local_360.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_1c8;
  EventLoop::enterScope((EventLoop *)local_1c8);
  pEVar8 = (Event *)operator_new(0x18);
  pEVar8->next = (Event *)0x0;
  (((PromiseFulfiller<int> *)&pEVar8->_vptr_Event)->super_PromiseRejector)._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_00604eb0;
  (((WeakFulfillerBase *)&pEVar8->loop)->super_Disposer)._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_00604ee8;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<int,kj::_::PromiseAndFulfillerAdapter<int>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<int>&>
            ((PromiseDisposer *)local_798,(WeakFulfiller<int> *)pEVar8);
  uVar17 = local_798[0]._0_8_;
  local_848._0_4_ = local_798[0].left;
  local_848._4_4_ = local_798[0].right;
  uStack_840 = (WeakFulfillerBase *)&pEVar8->loop;
  local_838 = pEVar8;
  yield();
  uVar18 = local_798[0]._0_8_;
  pPVar1 = ((PromiseArenaMember *)local_798[0]._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_798[0]._0_8_ - (long)pPVar1) < 0x28) {
    pvVar7 = operator_new(0x400);
    pTVar11 = (TransformPromiseNodeBase *)((long)pvVar7 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)local_798,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:743:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar7 + 0x3d8) = &PTR_destroy_006028a0;
    *(void **)((long)pvVar7 + 0x3e0) = pvVar7;
  }
  else {
    ((PromiseArenaMember *)local_798[0]._0_8_)->arena = (PromiseArena *)0x0;
    pTVar11 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)(local_798[0]._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)local_798,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:743:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar18 + -0x30))->arena = (PromiseArena *)&PTR_destroy_006028a0;
    ((PromiseArenaMember *)(uVar18 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar18 = local_798[0]._0_8_;
  if ((PromiseArenaMember *)local_798[0]._0_8_ != (PromiseArenaMember *)0x0) {
    local_798[0]._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar18);
  }
  local_878.ptr =
       (Promise<int> *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  ((PromiseArenaMember *)local_878.ptr)->_vptr_PromiseArenaMember = (_func_int **)uVar17;
  local_848 = (undefined1  [8])0x0;
  ((PromiseArenaMember *)local_878.ptr)->arena = (PromiseArena *)pTVar11;
  local_878.size_ = 2;
  local_878.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_3d0 = "run";
  local_3c8 = 0x60000002e9;
  location_01.function = "run";
  location_01.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_01.lineNumber = 0x2e9;
  location_01.columnNumber = 0x60;
  raceSuccessful<int>(&local_898,location_01);
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_3e8 = "run";
  local_3e0 = 0x60000002e9;
  uVar17 = 0x60000002e9;
  pcVar12 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcVar15 = "run";
  pAVar14 = &local_898;
  local_798[0].right = Promise<int>::wait((Promise<int> *)pAVar14,&local_360);
  pPVar9 = local_898.ptr;
  local_798[0].result = local_798[0].right == 0x7b;
  local_798[0].left = 0x7b;
  local_798[0].op.content.ptr = " == ";
  local_798[0].op.content.size_ = 5;
  if ((PromiseArenaMember *)local_898.ptr != (PromiseArenaMember *)0x0) {
    local_898.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
  }
  sVar2 = local_878.size_;
  pPVar9 = local_878.ptr;
  if ((PromiseArenaMember *)local_878.ptr != (PromiseArenaMember *)0x0) {
    local_878.ptr = (Promise<int> *)0x0;
    local_878.size_ = 0;
    (**(local_878.disposer)->_vptr_ArrayDisposer)
              (local_878.disposer,pPVar9,8,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct,pcVar12,pcVar15,uVar17);
  }
  if ((local_798[0].result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_7d0 = (char *)CONCAT44(local_7d0._4_4_,0x7b);
    local_878.ptr =
         (Promise<int> *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    ((PromiseArenaMember *)local_878.ptr)->_vptr_PromiseArenaMember = (_func_int **)0x0;
    local_848 = (undefined1  [8])0x0;
    ((PromiseArenaMember *)local_878.ptr)->arena = (PromiseArena *)0x0;
    local_878.size_ = 2;
    local_878.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_408 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_400 = "run";
    local_3f8 = 0x60000002e9;
    location_02.function = "run";
    location_02.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_02.lineNumber = 0x2e9;
    location_02.columnNumber = 0x60;
    raceSuccessful<int>(&local_898,location_02);
    local_420 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_418 = "run";
    local_410 = 0x60000002e9;
    uVar17 = 0x60000002e9;
    _Var6 = Promise<int>::wait((Promise<int> *)&local_898,&local_360);
    ppcVar16 = &local_7b0;
    local_7b0 = (char *)CONCAT44(local_7b0._4_4_,_Var6);
    ppcVar13 = &local_7d0;
    kj::_::Debug::log<char_const(&)[105],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2e9,ERROR,
               "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left.promise), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left.promise), kj::mv(right))).wait(waitScope)"
               ,(char (*) [105])
                "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left.promise), kj::mv(right))).wait(waitScope))"
               ,local_798,(int *)ppcVar13,(int *)ppcVar16);
    pPVar9 = local_898.ptr;
    if ((PromiseArenaMember *)local_898.ptr != (PromiseArenaMember *)0x0) {
      local_898.ptr = (Promise<int> *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
    }
    sVar2 = local_878.size_;
    pPVar9 = local_878.ptr;
    if ((PromiseArenaMember *)local_878.ptr != (PromiseArenaMember *)0x0) {
      local_878.ptr = (Promise<int> *)0x0;
      local_878.size_ = 0;
      (**(local_878.disposer)->_vptr_ArrayDisposer)
                (local_878.disposer,pPVar9,8,sVar2,sVar2,
                 ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct,ppcVar13,ppcVar16,uVar17);
    }
  }
  (**(((WeakFulfillerBase *)&pEVar8->loop)->super_Disposer)._vptr_Disposer)
            ((WeakFulfillerBase *)&pEVar8->loop,
             (_func_int *)
             ((long)&(((PromiseFulfiller<int> *)&pEVar8->_vptr_Event)->super_PromiseRejector).
                     _vptr_PromiseRejector +
             (long)(((PromiseFulfiller<int> *)&pEVar8->_vptr_Event)->super_PromiseRejector).
                   _vptr_PromiseRejector[-2]));
  if (local_350 == 0) {
    EventLoop::leaveScope((EventLoop *)local_360.node.ptr);
  }
  EventLoop::~EventLoop((EventLoop *)local_1c8);
  EventLoop::EventLoop((EventLoop *)local_1c8);
  local_358 = 0xffffffff;
  local_350 = 0;
  uStack_348 = 0;
  local_360.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_1c8;
  EventLoop::enterScope((EventLoop *)local_1c8);
  yield();
  uVar17 = local_798[0]._0_8_;
  pPVar1 = ((PromiseArenaMember *)local_798[0]._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_798[0]._0_8_ - (long)pPVar1) < 0x28) {
    pvVar7 = operator_new(0x400);
    pTVar11 = (TransformPromiseNodeBase *)((long)pvVar7 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)local_798,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:752:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar7 + 0x3d8) = &PTR_destroy_006028f8;
    *(void **)((long)pvVar7 + 0x3e0) = pvVar7;
  }
  else {
    ((PromiseArenaMember *)local_798[0]._0_8_)->arena = (PromiseArena *)0x0;
    pTVar11 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)(local_798[0]._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)local_798,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:752:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar17 + -0x30))->arena = (PromiseArena *)&PTR_destroy_006028f8;
    ((PromiseArenaMember *)(uVar17 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar17 = local_798[0]._0_8_;
  if ((PromiseArenaMember *)local_798[0]._0_8_ != (PromiseArenaMember *)0x0) {
    local_798[0]._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar17);
  }
  yield();
  uVar17 = local_798[0]._0_8_;
  pPVar1 = ((PromiseArenaMember *)local_798[0]._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_798[0]._0_8_ - (long)pPVar1) < 0x28) {
    pvVar7 = operator_new(0x400);
    pTVar10 = (TransformPromiseNodeBase *)((long)pvVar7 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar10,(OwnPromiseNode *)local_798,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:753:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar7 + 0x3d8) = &PTR_destroy_00602950;
    *(void **)((long)pvVar7 + 0x3e0) = pvVar7;
  }
  else {
    ((PromiseArenaMember *)local_798[0]._0_8_)->arena = (PromiseArena *)0x0;
    pTVar10 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)(local_798[0]._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar10,(OwnPromiseNode *)local_798,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:753:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar17 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00602950;
    ((PromiseArenaMember *)(uVar17 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar17 = local_798[0]._0_8_;
  if ((PromiseArenaMember *)local_798[0]._0_8_ != (PromiseArenaMember *)0x0) {
    local_798[0]._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar17);
  }
  local_848 = (undefined1  [8])
              kj::_::HeapArrayDisposer::allocateImpl
                        (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  (((PromiseNode *)local_848)->super_PromiseArenaMember)._vptr_PromiseArenaMember =
       (_func_int **)pTVar11;
  (((PromiseNode *)local_848)->super_PromiseArenaMember).arena = (PromiseArena *)pTVar10;
  uStack_840._0_1_ = true;
  uStack_840._1_1_ = false;
  uStack_840._2_6_ = 0;
  local_838 = (Event *)&kj::_::HeapArrayDisposer::instance;
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_430 = "run";
  local_428 = 0x58000002f3;
  location_03.function = "run";
  location_03.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_03.lineNumber = 0x2f3;
  location_03.columnNumber = 0x58;
  raceSuccessful<int>(&local_878,location_03);
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_448 = "run";
  local_440 = 0x58000002f3;
  uVar17 = 0x58000002f3;
  pcVar12 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcVar15 = "run";
  local_798[0].right = Promise<int>::wait((Promise<int> *)&local_878,&local_360);
  pPVar9 = local_878.ptr;
  local_798[0].result = local_798[0].right == 0x7b;
  local_798[0].left = 0x7b;
  local_798[0].op.content.ptr = " == ";
  local_798[0].op.content.size_ = 5;
  if ((PromiseArenaMember *)local_878.ptr != (PromiseArenaMember *)0x0) {
    local_878.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
  }
  uVar18 = uStack_840;
  auVar3 = local_848;
  if (local_848 != (undefined1  [8])0x0) {
    local_848 = (undefined1  [8])0x0;
    uStack_840._0_1_ = false;
    uStack_840._1_1_ = false;
    uStack_840._2_6_ = 0;
    (**local_838->_vptr_Event)
              (local_838,auVar3,8,uVar18,uVar18,ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct
               ,pcVar12,pcVar15,uVar17);
  }
  if ((local_798[0].result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_898.ptr = (Promise<int> *)CONCAT44(local_898.ptr._4_4_,0x7b);
    local_848 = (undefined1  [8])
                kj::_::HeapArrayDisposer::allocateImpl
                          (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    (((PromiseNode *)local_848)->super_PromiseArenaMember)._vptr_PromiseArenaMember =
         (_func_int **)0x0;
    (((PromiseNode *)local_848)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    uStack_840._0_1_ = true;
    uStack_840._1_1_ = false;
    uStack_840._2_6_ = 0;
    local_838 = (Event *)&kj::_::HeapArrayDisposer::instance;
    local_468 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_460 = "run";
    local_458 = 0x58000002f3;
    location_04.function = "run";
    location_04.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_04.lineNumber = 0x2f3;
    location_04.columnNumber = 0x58;
    raceSuccessful<int>(&local_878,location_04);
    local_480 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_478 = "run";
    local_470 = 0x58000002f3;
    uVar17 = 0x58000002f3;
    _Var6 = Promise<int>::wait((Promise<int> *)&local_878,&local_360);
    ppcVar16 = &local_7d0;
    local_7d0 = (char *)CONCAT44(local_7d0._4_4_,_Var6);
    kj::_::Debug::log<char_const(&)[97],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2f3,ERROR,
               "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
               ,(char (*) [97])
                "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))"
               ,local_798,(int *)pAVar14,(int *)ppcVar16);
    pPVar9 = local_878.ptr;
    if ((PromiseArenaMember *)local_878.ptr != (PromiseArenaMember *)0x0) {
      local_878.ptr = (Promise<int> *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
    }
    uVar18 = uStack_840;
    auVar3 = local_848;
    if (local_848 != (undefined1  [8])0x0) {
      local_848 = (undefined1  [8])0x0;
      uStack_840._0_1_ = false;
      uStack_840._1_1_ = false;
      uStack_840._2_6_ = 0;
      (**local_838->_vptr_Event)
                (local_838,auVar3,8,uVar18,uVar18,
                 ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct,pAVar14,ppcVar16,uVar17);
    }
  }
  if (local_350 == 0) {
    EventLoop::leaveScope((EventLoop *)local_360.node.ptr);
  }
  EventLoop::~EventLoop((EventLoop *)local_1c8);
  EventLoop::EventLoop((EventLoop *)local_1c8);
  local_358 = 0xffffffff;
  local_350 = 0;
  uStack_348 = 0;
  local_360.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_1c8;
  EventLoop::enterScope((EventLoop *)local_1c8);
  yield();
  uVar17 = local_798[0]._0_8_;
  pPVar1 = ((PromiseArenaMember *)local_798[0]._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_798[0]._0_8_ - (long)pPVar1) < 0x28) {
    pvVar7 = operator_new(0x400);
    pTVar11 = (TransformPromiseNodeBase *)((long)pvVar7 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)local_798,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:762:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar7 + 0x3d8) = &PTR_destroy_006029a8;
    *(void **)((long)pvVar7 + 0x3e0) = pvVar7;
  }
  else {
    ((PromiseArenaMember *)local_798[0]._0_8_)->arena = (PromiseArena *)0x0;
    pTVar11 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)(local_798[0]._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)local_798,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:762:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar17 + -0x30))->arena = (PromiseArena *)&PTR_destroy_006029a8;
    ((PromiseArenaMember *)(uVar17 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar17 = local_798[0]._0_8_;
  if ((PromiseArenaMember *)local_798[0]._0_8_ != (PromiseArenaMember *)0x0) {
    local_798[0]._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar17);
  }
  yield();
  uVar17 = local_798[0]._0_8_;
  pPVar1 = ((PromiseArenaMember *)local_798[0]._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_798[0]._0_8_ - (long)pPVar1) < 0x28) {
    pvVar7 = operator_new(0x400);
    pTVar10 = (TransformPromiseNodeBase *)((long)pvVar7 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar10,(OwnPromiseNode *)local_798,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:763:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar7 + 0x3d8) = &PTR_destroy_00602a00;
    *(void **)((long)pvVar7 + 0x3e0) = pvVar7;
  }
  else {
    ((PromiseArenaMember *)local_798[0]._0_8_)->arena = (PromiseArena *)0x0;
    pTVar10 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)(local_798[0]._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar10,(OwnPromiseNode *)local_798,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:763:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar17 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00602a00;
    ((PromiseArenaMember *)(uVar17 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar17 = local_798[0]._0_8_;
  local_848 = (undefined1  [8])pTVar10;
  if ((PromiseArenaMember *)local_798[0]._0_8_ != (PromiseArenaMember *)0x0) {
    local_798[0]._0_8_ = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar17);
  }
  local_798[0]._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  local_798[0].op.content.ptr = "run";
  local_798[0].op.content.size_ = 0x12000002fb;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<int>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_878,(OwnPromiseNode *)local_848,(SourceLocation *)local_798);
  auVar3 = local_848;
  if (local_848 != (undefined1  [8])0x0) {
    local_848 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar3);
  }
  local_848 = (undefined1  [8])
              kj::_::HeapArrayDisposer::allocateImpl
                        (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  (((PromiseNode *)local_848)->super_PromiseArenaMember)._vptr_PromiseArenaMember =
       (_func_int **)pTVar11;
  (((PromiseNode *)local_848)->super_PromiseArenaMember).arena = (PromiseArena *)local_878.ptr;
  local_878.ptr = (Promise<int> *)0x0;
  uStack_840._0_1_ = true;
  uStack_840._1_1_ = false;
  uStack_840._2_6_ = 0;
  local_838 = (Event *)&kj::_::HeapArrayDisposer::instance;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_490 = "run";
  local_488 = 0x58000002fd;
  location_05.function = "run";
  location_05.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_05.lineNumber = 0x2fd;
  location_05.columnNumber = 0x58;
  raceSuccessful<int>(&local_898,location_05);
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_4a8 = "run";
  local_4a0 = 0x58000002fd;
  uVar17 = 0x58000002fd;
  pcVar12 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcVar15 = "run";
  local_798[0].right = Promise<int>::wait((Promise<int> *)&local_898,&local_360);
  pPVar9 = local_898.ptr;
  local_798[0].result = local_798[0].right == 0x1c8;
  local_798[0].left = 0x1c8;
  local_798[0].op.content.ptr = " == ";
  local_798[0].op.content.size_ = 5;
  if ((PromiseArenaMember *)local_898.ptr != (PromiseArenaMember *)0x0) {
    local_898.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
  }
  uVar18 = uStack_840;
  auVar3 = local_848;
  if (local_848 != (undefined1  [8])0x0) {
    local_848 = (undefined1  [8])0x0;
    uStack_840._0_1_ = false;
    uStack_840._1_1_ = false;
    uStack_840._2_6_ = 0;
    (**local_838->_vptr_Event)
              (local_838,auVar3,8,uVar18,uVar18,ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct
               ,pcVar12,pcVar15,uVar17);
  }
  if ((local_798[0].result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_7d0 = (char *)CONCAT44(local_7d0._4_4_,0x1c8);
    local_848 = (undefined1  [8])
                kj::_::HeapArrayDisposer::allocateImpl
                          (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    (((PromiseNode *)local_848)->super_PromiseArenaMember)._vptr_PromiseArenaMember =
         (_func_int **)0x0;
    (((PromiseNode *)local_848)->super_PromiseArenaMember).arena = (PromiseArena *)local_878.ptr;
    local_878.ptr = (Promise<int> *)0x0;
    uStack_840._0_1_ = true;
    uStack_840._1_1_ = false;
    uStack_840._2_6_ = 0;
    local_838 = (Event *)&kj::_::HeapArrayDisposer::instance;
    local_4c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_4c0 = "run";
    local_4b8 = 0x58000002fd;
    location_06.function = "run";
    location_06.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_06.lineNumber = 0x2fd;
    location_06.columnNumber = 0x58;
    raceSuccessful<int>(&local_898,location_06);
    local_4e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_4d8 = "run";
    local_4d0 = 0x58000002fd;
    uVar17 = 0x58000002fd;
    _Var6 = Promise<int>::wait((Promise<int> *)&local_898,&local_360);
    ppcVar16 = &local_7b0;
    local_7b0 = (char *)CONCAT44(local_7b0._4_4_,_Var6);
    ppcVar13 = &local_7d0;
    kj::_::Debug::log<char_const(&)[97],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x2fd,ERROR,
               "\"failed: expected \" \"(456) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 456, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
               ,(char (*) [97])
                "failed: expected (456) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))"
               ,local_798,(int *)ppcVar13,(int *)ppcVar16);
    pPVar9 = local_898.ptr;
    if ((PromiseArenaMember *)local_898.ptr != (PromiseArenaMember *)0x0) {
      local_898.ptr = (Promise<int> *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
    }
    uVar18 = uStack_840;
    auVar3 = local_848;
    if (local_848 != (undefined1  [8])0x0) {
      local_848 = (undefined1  [8])0x0;
      uStack_840._0_1_ = false;
      uStack_840._1_1_ = false;
      uStack_840._2_6_ = 0;
      (**local_838->_vptr_Event)
                (local_838,auVar3,8,uVar18,uVar18,
                 ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct,ppcVar13,ppcVar16,uVar17);
    }
  }
  pPVar9 = local_878.ptr;
  if ((PromiseArenaMember *)local_878.ptr != (PromiseArenaMember *)0x0) {
    local_878.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
  }
  if (local_350 == 0) {
    EventLoop::leaveScope((EventLoop *)local_360.node.ptr);
  }
  EventLoop::~EventLoop((EventLoop *)local_1c8);
  EventLoop::EventLoop((EventLoop *)local_1c8);
  local_358 = 0xffffffff;
  local_350 = 0;
  uStack_348 = 0;
  local_360.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_1c8;
  EventLoop::enterScope((EventLoop *)local_1c8);
  yield();
  uVar17 = local_798[0]._0_8_;
  pPVar1 = ((PromiseArenaMember *)local_798[0]._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_798[0]._0_8_ - (long)pPVar1) < 0x28) {
    pvVar7 = operator_new(0x400);
    pTVar11 = (TransformPromiseNodeBase *)((long)pvVar7 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)local_798,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:772:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar7 + 0x3d8) = &PTR_destroy_00602a58;
    *(void **)((long)pvVar7 + 0x3e0) = pvVar7;
  }
  else {
    ((PromiseArenaMember *)local_798[0]._0_8_)->arena = (PromiseArena *)0x0;
    pTVar11 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)(local_798[0]._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)local_798,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:772:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar17 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00602a58;
    ((PromiseArenaMember *)(uVar17 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar17 = local_798[0]._0_8_;
  if ((PromiseArenaMember *)local_798[0]._0_8_ != (PromiseArenaMember *)0x0) {
    local_798[0]._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar17);
  }
  pAVar14 = &local_898;
  yield();
  pPVar9 = local_898.ptr;
  pPVar1 = *(PromiseArena **)((long)local_898.ptr + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_898.ptr - (long)pPVar1) < 0x28) {
    pvVar7 = operator_new(0x400);
    pTVar10 = (TransformPromiseNodeBase *)((long)pvVar7 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar10,(OwnPromiseNode *)&local_898,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:773:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar7 + 0x3d8) = &PTR_destroy_00602ab0;
    *(void **)((long)pvVar7 + 0x3e0) = pvVar7;
  }
  else {
    *(PromiseArena **)((long)local_898.ptr + 8) = (PromiseArena *)0x0;
    pTVar10 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)((long)local_898.ptr + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar10,(OwnPromiseNode *)&local_898,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:773:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)((long)pPVar9 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00602ab0;
    ((PromiseArenaMember *)((long)pPVar9 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_798[0]._0_8_ = &DAT_0048a171;
  local_798[0].op.content.ptr = "then";
  local_798[0].op.content.size_ = (size_t)&DAT_4c0000058b;
  local_878.ptr = (Promise<int> *)pTVar10;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)local_848,(OwnPromiseNode *)&local_878,(SourceLocation *)local_798);
  auVar3 = local_848;
  pPVar9 = local_878.ptr;
  if ((TransformPromiseNodeBase *)local_878.ptr != (TransformPromiseNodeBase *)0x0) {
    local_878.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
  }
  pPVar9 = local_898.ptr;
  if ((PromiseArenaMember *)local_898.ptr != (PromiseArenaMember *)0x0) {
    local_898.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
  }
  local_848 = (undefined1  [8])
              kj::_::HeapArrayDisposer::allocateImpl
                        (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  (((PromiseNode *)local_848)->super_PromiseArenaMember)._vptr_PromiseArenaMember =
       (_func_int **)pTVar11;
  (((PromiseNode *)local_848)->super_PromiseArenaMember).arena = (PromiseArena *)auVar3;
  uStack_840._0_1_ = true;
  uStack_840._1_1_ = false;
  uStack_840._2_6_ = 0;
  local_838 = (Event *)&kj::_::HeapArrayDisposer::instance;
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_4f0 = "run";
  local_4e8 = 0x5800000309;
  location_07.function = "run";
  location_07.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_07.lineNumber = 0x309;
  location_07.columnNumber = 0x58;
  raceSuccessful<int>(&local_878,location_07);
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_508 = "run";
  local_500 = 0x5800000309;
  uVar17 = 0x5800000309;
  pcVar12 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcVar15 = "run";
  local_798[0].right = Promise<int>::wait((Promise<int> *)&local_878,&local_360);
  pPVar9 = local_878.ptr;
  local_798[0].result = local_798[0].right == 0x7b;
  local_798[0].left = 0x7b;
  local_798[0].op.content.ptr = " == ";
  local_798[0].op.content.size_ = 5;
  if ((TransformPromiseNodeBase *)local_878.ptr != (TransformPromiseNodeBase *)0x0) {
    local_878.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
  }
  uVar18 = uStack_840;
  auVar3 = local_848;
  if (local_848 != (undefined1  [8])0x0) {
    local_848 = (undefined1  [8])0x0;
    uStack_840._0_1_ = false;
    uStack_840._1_1_ = false;
    uStack_840._2_6_ = 0;
    (**local_838->_vptr_Event)
              (local_838,auVar3,8,uVar18,uVar18,ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct
               ,pcVar12,pcVar15,uVar17);
  }
  if ((local_798[0].result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_898.ptr = (Promise<int> *)CONCAT44(local_898.ptr._4_4_,0x7b);
    local_848 = (undefined1  [8])
                kj::_::HeapArrayDisposer::allocateImpl
                          (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    (((PromiseNode *)local_848)->super_PromiseArenaMember)._vptr_PromiseArenaMember =
         (_func_int **)0x0;
    (((PromiseNode *)local_848)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    uStack_840._0_1_ = true;
    uStack_840._1_1_ = false;
    uStack_840._2_6_ = 0;
    local_838 = (Event *)&kj::_::HeapArrayDisposer::instance;
    local_528 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_520 = "run";
    local_518 = 0x5800000309;
    location_08.function = "run";
    location_08.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_08.lineNumber = 0x309;
    location_08.columnNumber = 0x58;
    raceSuccessful<int>(&local_878,location_08);
    local_540 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_538 = "run";
    local_530 = 0x5800000309;
    uVar17 = 0x5800000309;
    _Var6 = Promise<int>::wait((Promise<int> *)&local_878,&local_360);
    ppcVar16 = &local_7d0;
    local_7d0 = (char *)CONCAT44(local_7d0._4_4_,_Var6);
    kj::_::Debug::log<char_const(&)[97],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x309,ERROR,
               "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
               ,(char (*) [97])
                "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))"
               ,local_798,(int *)pAVar14,(int *)ppcVar16);
    pPVar9 = local_878.ptr;
    if ((TransformPromiseNodeBase *)local_878.ptr != (TransformPromiseNodeBase *)0x0) {
      local_878.ptr = (Promise<int> *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
    }
    uVar18 = uStack_840;
    auVar3 = local_848;
    if (local_848 != (undefined1  [8])0x0) {
      local_848 = (undefined1  [8])0x0;
      uStack_840._0_1_ = false;
      uStack_840._1_1_ = false;
      uStack_840._2_6_ = 0;
      (**local_838->_vptr_Event)
                (local_838,auVar3,8,uVar18,uVar18,
                 ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct,pAVar14,ppcVar16,uVar17);
    }
  }
  if (local_350 == 0) {
    EventLoop::leaveScope((EventLoop *)local_360.node.ptr);
  }
  EventLoop::~EventLoop((EventLoop *)local_1c8);
  EventLoop::EventLoop((EventLoop *)local_1c8);
  local_358 = 0xffffffff;
  local_350 = 0;
  uStack_348 = 0;
  local_360.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_1c8;
  EventLoop::enterScope((EventLoop *)local_1c8);
  pAVar14 = &local_898;
  yield();
  pPVar9 = local_898.ptr;
  pPVar1 = *(PromiseArena **)((long)local_898.ptr + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_898.ptr - (long)pPVar1) < 0x28) {
    pvVar7 = operator_new(0x400);
    pTVar11 = (TransformPromiseNodeBase *)((long)pvVar7 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)&local_898,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:783:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar7 + 0x3d8) = &PTR_destroy_00602b08;
    *(void **)((long)pvVar7 + 0x3e0) = pvVar7;
  }
  else {
    *(PromiseArena **)((long)local_898.ptr + 8) = (PromiseArena *)0x0;
    pTVar11 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)((long)local_898.ptr + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)&local_898,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:783:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)((long)pPVar9 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00602b08;
    ((PromiseArenaMember *)((long)pPVar9 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_798[0]._0_8_ = &DAT_0048a171;
  local_798[0].op.content.ptr = "then";
  local_798[0].op.content.size_ = (size_t)&DAT_4c0000058b;
  local_878.ptr = (Promise<int> *)pTVar11;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)local_848,(OwnPromiseNode *)&local_878,(SourceLocation *)local_798);
  auVar3 = local_848;
  pPVar9 = local_878.ptr;
  if ((TransformPromiseNodeBase *)local_878.ptr != (TransformPromiseNodeBase *)0x0) {
    local_878.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
  }
  pPVar9 = local_898.ptr;
  if ((PromiseArenaMember *)local_898.ptr != (PromiseArenaMember *)0x0) {
    local_898.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
  }
  yield();
  uVar17 = local_798[0]._0_8_;
  pPVar1 = ((PromiseArenaMember *)local_798[0]._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_798[0]._0_8_ - (long)pPVar1) < 0x28) {
    pvVar7 = operator_new(0x400);
    pTVar11 = (TransformPromiseNodeBase *)((long)pvVar7 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)local_798,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:786:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar7 + 0x3d8) = &PTR_destroy_00602b60;
    *(void **)((long)pvVar7 + 0x3e0) = pvVar7;
  }
  else {
    ((PromiseArenaMember *)local_798[0]._0_8_)->arena = (PromiseArena *)0x0;
    pTVar11 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)(local_798[0]._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)local_798,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:786:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar17 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00602b60;
    ((PromiseArenaMember *)(uVar17 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  uVar17 = local_798[0]._0_8_;
  if ((PromiseArenaMember *)local_798[0]._0_8_ != (PromiseArenaMember *)0x0) {
    local_798[0]._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar17);
  }
  local_848 = (undefined1  [8])
              kj::_::HeapArrayDisposer::allocateImpl
                        (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  (((PromiseNode *)local_848)->super_PromiseArenaMember)._vptr_PromiseArenaMember =
       (_func_int **)auVar3;
  (((PromiseNode *)local_848)->super_PromiseArenaMember).arena = (PromiseArena *)pTVar11;
  uStack_840._0_1_ = true;
  uStack_840._1_1_ = false;
  uStack_840._2_6_ = 0;
  local_838 = (Event *)&kj::_::HeapArrayDisposer::instance;
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_550 = "run";
  local_548 = 0x5800000314;
  location_09.function = "run";
  location_09.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_09.lineNumber = 0x314;
  location_09.columnNumber = 0x58;
  raceSuccessful<int>(&local_878,location_09);
  local_570 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_568 = "run";
  local_560 = 0x5800000314;
  uVar17 = 0x5800000314;
  pcVar12 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcVar15 = "run";
  local_798[0].right = Promise<int>::wait((Promise<int> *)&local_878,&local_360);
  pPVar9 = local_878.ptr;
  local_798[0].result = local_798[0].right == 0x7b;
  local_798[0].left = 0x7b;
  local_798[0].op.content.ptr = " == ";
  local_798[0].op.content.size_ = 5;
  if ((TransformPromiseNodeBase *)local_878.ptr != (TransformPromiseNodeBase *)0x0) {
    local_878.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
  }
  uVar18 = uStack_840;
  auVar3 = local_848;
  if (local_848 != (undefined1  [8])0x0) {
    local_848 = (undefined1  [8])0x0;
    uStack_840._0_1_ = false;
    uStack_840._1_1_ = false;
    uStack_840._2_6_ = 0;
    (**local_838->_vptr_Event)
              (local_838,auVar3,8,uVar18,uVar18,ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct
               ,pcVar12,pcVar15,uVar17);
  }
  if ((local_798[0].result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_898.ptr = (Promise<int> *)CONCAT44(local_898.ptr._4_4_,0x7b);
    local_848 = (undefined1  [8])
                kj::_::HeapArrayDisposer::allocateImpl
                          (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    (((PromiseNode *)local_848)->super_PromiseArenaMember)._vptr_PromiseArenaMember =
         (_func_int **)0x0;
    (((PromiseNode *)local_848)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    uStack_840._0_1_ = true;
    uStack_840._1_1_ = false;
    uStack_840._2_6_ = 0;
    local_838 = (Event *)&kj::_::HeapArrayDisposer::instance;
    local_588 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_580 = "run";
    local_578 = 0x5800000314;
    location_10.function = "run";
    location_10.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_10.lineNumber = 0x314;
    location_10.columnNumber = 0x58;
    raceSuccessful<int>(&local_878,location_10);
    local_5a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_598 = "run";
    local_590 = 0x5800000314;
    uVar17 = 0x5800000314;
    _Var6 = Promise<int>::wait((Promise<int> *)&local_878,&local_360);
    ppcVar16 = &local_7d0;
    local_7d0 = (char *)CONCAT44(local_7d0._4_4_,_Var6);
    kj::_::Debug::log<char_const(&)[97],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x314,ERROR,
               "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
               ,(char (*) [97])
                "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope))"
               ,local_798,(int *)pAVar14,(int *)ppcVar16);
    pPVar9 = local_878.ptr;
    if ((TransformPromiseNodeBase *)local_878.ptr != (TransformPromiseNodeBase *)0x0) {
      local_878.ptr = (Promise<int> *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
    }
    uVar18 = uStack_840;
    auVar3 = local_848;
    if (local_848 != (undefined1  [8])0x0) {
      local_848 = (undefined1  [8])0x0;
      uStack_840._0_1_ = false;
      uStack_840._1_1_ = false;
      uStack_840._2_6_ = 0;
      (**local_838->_vptr_Event)
                (local_838,auVar3,8,uVar18,uVar18,
                 ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct,pAVar14,ppcVar16,uVar17);
    }
  }
  if (local_350 == 0) {
    EventLoop::leaveScope((EventLoop *)local_360.node.ptr);
  }
  EventLoop::~EventLoop((EventLoop *)local_1c8);
  EventLoop::EventLoop((EventLoop *)local_848);
  local_878.size_ = CONCAT44(local_878.size_._4_4_,0xffffffff);
  local_878.disposer = (ArrayDisposer *)0x0;
  uStack_860 = 0;
  local_878.ptr = (Promise<int> *)local_848;
  EventLoop::enterScope((EventLoop *)local_848);
  yield();
  pPVar9 = local_898.ptr;
  pPVar1 = *(PromiseArena **)((long)local_898.ptr + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_898.ptr - (long)pPVar1) < 0x28) {
    pvVar7 = operator_new(0x400);
    pTVar11 = (TransformPromiseNodeBase *)((long)pvVar7 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)&local_898,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:795:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar7 + 0x3d8) = &PTR_destroy_00602bb8;
    *(void **)((long)pvVar7 + 0x3e0) = pvVar7;
  }
  else {
    *(PromiseArena **)((long)local_898.ptr + 8) = (PromiseArena *)0x0;
    pTVar11 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)((long)local_898.ptr + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)&local_898,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:795:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)((long)pPVar9 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00602bb8;
    ((PromiseArenaMember *)((long)pPVar9 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_1c8 = (undefined1  [8])&DAT_0048a171;
  local_1c0.ownFile.content.ptr = "then";
  local_1c0.ownFile.content.size_ = (size_t)&DAT_4c0000058b;
  local_798[0]._0_8_ = pTVar11;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_360,(OwnPromiseNode *)local_798,(SourceLocation *)local_1c8);
  PVar4.node.ptr = local_360.node.ptr;
  uVar17 = local_798[0]._0_8_;
  if ((TransformPromiseNodeBase *)local_798[0]._0_8_ != (TransformPromiseNodeBase *)0x0) {
    local_798[0]._0_8_ = (TransformPromiseNodeBase *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar17);
  }
  pPVar9 = local_898.ptr;
  if ((PromiseArenaMember *)local_898.ptr != (PromiseArenaMember *)0x0) {
    local_898.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
  }
  yield();
  pPVar9 = local_898.ptr;
  pPVar1 = *(PromiseArena **)((long)local_898.ptr + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_898.ptr - (long)pPVar1) < 0x28) {
    pvVar7 = operator_new(0x400);
    pTVar11 = (TransformPromiseNodeBase *)((long)pvVar7 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)&local_898,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:798:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar7 + 0x3d8) = &PTR_destroy_00602c10;
    *(void **)((long)pvVar7 + 0x3e0) = pvVar7;
  }
  else {
    *(PromiseArena **)((long)local_898.ptr + 8) = (PromiseArena *)0x0;
    pTVar11 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)((long)local_898.ptr + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)&local_898,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:798:28)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)((long)pPVar9 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00602c10;
    ((PromiseArenaMember *)((long)pPVar9 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_1c8 = (undefined1  [8])&DAT_0048a171;
  local_1c0.ownFile.content.ptr = "then";
  local_1c0.ownFile.content.size_ = (size_t)&DAT_4c0000058b;
  local_798[0]._0_8_ = pTVar11;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_360,(OwnPromiseNode *)local_798,(SourceLocation *)local_1c8);
  PVar5.node.ptr = local_360.node.ptr;
  uVar17 = local_798[0]._0_8_;
  if ((TransformPromiseNodeBase *)local_798[0]._0_8_ != (TransformPromiseNodeBase *)0x0) {
    local_798[0]._0_8_ = (TransformPromiseNodeBase *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar17);
  }
  pPVar9 = local_898.ptr;
  if ((PromiseArenaMember *)local_898.ptr != (PromiseArenaMember *)0x0) {
    local_898.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
  }
  local_898.ptr =
       (Promise<int> *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  ((local_898.ptr)->super_PromiseBase).node.ptr = (PromiseNode *)PVar4.node.ptr;
  local_898.ptr[1].super_PromiseBase.node.ptr = (PromiseNode *)PVar5.node.ptr;
  local_898.size_ = 2;
  local_898.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_7d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_7c8 = "operator()";
  local_7c0 = 0x6100000322;
  location_11.function = "operator()";
  location_11.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_11.lineNumber = 0x322;
  location_11.columnNumber = 0x61;
  raceSuccessful<int>((Array<kj::Promise<int>_> *)(local_858 + 8),location_11);
  local_7b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_7a8 = "operator()";
  local_7a0 = 0x6100000322;
  uVar18 = 0x6100000322;
  pcVar12 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcVar15 = "operator()";
  Promise<int>::wait((Promise<int> *)(local_858 + 8),&local_878);
  uVar17 = local_858._8_8_;
  if ((PromiseArenaMember *)local_858._8_8_ != (PromiseArenaMember *)0x0) {
    local_858._8_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar17);
  }
  sVar2 = local_898.size_;
  pPVar9 = local_898.ptr;
  if (local_898.ptr != (Promise<int> *)0x0) {
    local_898.ptr = (Promise<int> *)0x0;
    local_898.size_ = 0;
    (**(local_898.disposer)->_vptr_ArrayDisposer)
              (local_898.disposer,pPVar9,8,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::Promise<int>_>::destruct,pcVar12,pcVar15,uVar18);
  }
  local_1c8 = (undefined1  [8])((ulong)local_1c8 & 0xffffffffffffff00);
  if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[89]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x322,ERROR,
               "\"code did not throw: \" \"raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)\""
               ,(char (*) [89])
                "code did not throw: raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope)"
              );
  }
  if (local_1c8[0] == '\x01') {
    Exception::~Exception(&local_1c0);
  }
  if (local_878.disposer == (ArrayDisposer *)0x0) {
    EventLoop::leaveScope((EventLoop *)local_878.ptr);
  }
  EventLoop::~EventLoop((EventLoop *)local_848);
  EventLoop::EventLoop((EventLoop *)local_1c8);
  local_358 = 0xffffffff;
  local_350 = 0;
  uStack_348 = 0;
  local_360.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_1c8;
  EventLoop::enterScope((EventLoop *)local_1c8);
  yield();
  uVar17 = local_858._0_8_;
  pPVar1 = ((PromiseArenaMember *)local_858._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_858._0_8_ - (long)pPVar1) < 0x28) {
    pvVar7 = operator_new(0x400);
    pTVar11 = (TransformPromiseNodeBase *)((long)pvVar7 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)local_858,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:819:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar7 + 0x3d8) = &PTR_destroy_00602cb8;
    *(void **)((long)pvVar7 + 0x3e0) = pvVar7;
  }
  else {
    ((PromiseArenaMember *)local_858._0_8_)->arena = (PromiseArena *)0x0;
    pTVar11 = (TransformPromiseNodeBase *)&((PromiseArenaMember *)(local_858._0_8_ + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar11,(OwnPromiseNode *)local_858,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:819:27)>
               ::anon_class_1_0_00000001_for_func::operator());
    ((PromiseArenaMember *)(uVar17 + -0x30))->arena = (PromiseArena *)&PTR_destroy_00602cb8;
    ((PromiseArenaMember *)(uVar17 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_798[0]._0_8_ = &DAT_0048a171;
  local_798[0].op.content.ptr = "then";
  local_798[0].op.content.size_ = (size_t)&DAT_4c0000058b;
  local_878.ptr = (Promise<int> *)pTVar11;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)local_848,(OwnPromiseNode *)&local_878,(SourceLocation *)local_798);
  auVar3 = local_848;
  pPVar9 = local_878.ptr;
  if ((TransformPromiseNodeBase *)local_878.ptr != (TransformPromiseNodeBase *)0x0) {
    local_878.ptr = (Promise<int> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pPVar9);
  }
  uVar17 = local_858._0_8_;
  if ((PromiseArenaMember *)local_858._0_8_ != (PromiseArenaMember *)0x0) {
    local_858._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar17);
  }
  pEVar8 = (Event *)operator_new(0x18);
  pEVar8->next = (Event *)0x0;
  pEVar8->_vptr_Event = (_func_int **)&PTR_reject_00602d10;
  pEVar8->loop = (EventLoop *)&PTR_disposeImpl_00602d48;
  pvVar7 = operator_new(0x400);
  *(undefined8 *)((long)pvVar7 + 0x238) = 0;
  *(undefined ***)((long)pvVar7 + 0x228) = &PTR_destroy_00602dc0;
  *(undefined ***)((long)pvVar7 + 0x240) = &PTR_reject_00602e10;
  *(undefined1 *)((long)pvVar7 + 0x248) = 0;
  *(undefined1 *)((long)pvVar7 + 0x3e0) = 0;
  *(undefined1 *)((long)pvVar7 + 1000) = 1;
  *(Event **)((long)pvVar7 + 0x3f0) = (Event *)((long)pvVar7 + 0x240);
  *(Event **)((long)pvVar7 + 0x3f8) = pEVar8;
  pEVar8->next = (Event *)((long)pvVar7 + 0x240);
  *(void **)((long)pvVar7 + 0x230) = pvVar7;
  local_848 = (undefined1  [8])((long)pvVar7 + 0x228);
  uStack_840 = (WeakFulfillerBase *)&pEVar8->loop;
  local_838 = pEVar8;
  pPVar9 = (Promise<int> *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  (pPVar9->super_PromiseBase).node.ptr = (PromiseNode *)auVar3;
  pPVar9[1].super_PromiseBase.node.ptr = (PromiseNode *)((long)pvVar7 + 0x228);
  local_848 = (undefined1  [8])0x0;
  local_878.size_ = 2;
  local_878.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_5b0 = "run";
  local_5a8 = 0x2a00000337;
  location_12.function = "run";
  location_12.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_12.lineNumber = 0x337;
  location_12.columnNumber = 0x2a;
  local_878.ptr = pPVar9;
  raceSuccessful<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>
            ((Array<kj::Promise<NoCopy>_> *)local_858,location_12);
  local_5d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_5c8 = "run";
  local_5c0 = 0x2a00000337;
  local_798[0].right = Promise<NoCopy>::wait((Promise<NoCopy> *)local_858,&local_360);
  uVar17 = local_858._0_8_;
  local_798[0].result = local_798[0].right == 0x7b;
  local_798[0].left = 0x7b;
  local_798[0].op.content.ptr = " == ";
  local_798[0].op.content.size_ = 5;
  if ((PromiseArenaMember *)local_858._0_8_ != (PromiseArenaMember *)0x0) {
    local_858._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar17);
  }
  local_878.ptr = (Promise<int> *)0x0;
  local_878.size_ = 0;
  kj::_::HeapArrayDisposer::disposeImpl
            ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,pPVar9,8,2,2,
             ArrayDisposer::Dispose_<kj::Promise<NoCopy>_>::destruct);
  if ((local_798[0].result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_7b4 = 0x7b;
    pPVar9 = (Promise<int> *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    (pPVar9->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
    pPVar9[1].super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    local_848 = (undefined1  [8])0x0;
    local_878.size_ = 2;
    local_878.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_5e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_5e0 = "run";
    local_5d8 = 0x2a00000337;
    location_13.function = "run";
    location_13.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    location_13.lineNumber = 0x337;
    location_13.columnNumber = 0x2a;
    local_878.ptr = pPVar9;
    raceSuccessful<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>
              ((Array<kj::Promise<NoCopy>_> *)local_858,location_13);
    local_600 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_5f8 = "run";
    local_5f0 = 0x2a00000337;
    local_604 = Promise<NoCopy>::wait((Promise<NoCopy> *)local_858,&local_360);
    kj::_::Debug::log<char_const(&)[108],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x337,ERROR,
               "\"failed: expected \" \"(123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope).i)\", _kjCondition, 123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope).i"
               ,(char (*) [108])
                "failed: expected (123) == (raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise))) .wait(waitScope).i)"
               ,local_798,&local_7b4,&local_604);
    uVar17 = local_858._0_8_;
    if ((PromiseArenaMember *)local_858._0_8_ != (PromiseArenaMember *)0x0) {
      local_858._0_8_ = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar17);
    }
    local_878.ptr = (Promise<int> *)0x0;
    local_878.size_ = 0;
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,pPVar9,8,2,2,
               ArrayDisposer::Dispose_<kj::Promise<NoCopy>_>::destruct);
  }
  (*(code *)(pEVar8->loop->port).ptr)
            (&pEVar8->loop,(_func_int *)((long)&pEVar8->_vptr_Event + (long)pEVar8->_vptr_Event[-2])
            );
  if (local_350 == 0) {
    EventLoop::leaveScope((EventLoop *)local_360.node.ptr);
  }
  EventLoop::~EventLoop((EventLoop *)local_1c8);
  return;
}

Assistant:

TEST(Async, RaceSuccessful) {
  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = newPromiseAndFulfiller<int>(); // never fulfilled

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise)))
                       .wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = newPromiseAndFulfiller<int>(); // never fulfilled
    auto right = evalLater([&]() { return 123; });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left.promise), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = evalLater([&]() { return 456; });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = evalLater([&]() { return 456; }).eagerlyEvaluate(nullptr);

    EXPECT_EQ(456, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() { return 123; });
    auto right = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }
  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });
    auto right = evalLater([&]() { return 123; });

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });
    auto right = evalLater([&]() -> Promise<int>{
      kj::throwFatalException(KJ_EXCEPTION(FAILED, "evaluation failed"));
    });

    KJ_EXPECT_THROW(FAILED, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right))).wait(waitScope));
  }

  {
    struct NoCopy {
      int i;

      NoCopy(int i) : i(i) {}
      NoCopy(const NoCopy&) = delete;

      NoCopy(NoCopy&&) = default;
      NoCopy& operator=(NoCopy&&) = default;
    };

    EventLoop loop;
    WaitScope waitScope(loop);

    auto left = evalLater([]() -> kj::Promise<NoCopy> { return NoCopy(123); });
    kj::PromiseFulfillerPair<NoCopy> right = newPromiseAndFulfiller<NoCopy>(); // never fulfilled

    EXPECT_EQ(123, raceSuccessful(kj::arr(kj::mv(left), kj::mv(right.promise)))
                       .wait(waitScope).i);
  }
}